

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDScanState<float>::ScanVector<unsigned_int,true>
          (AlpRDScanState<float> *this,uint *values,idx_t vector_size)

{
  idx_t iVar1;
  ulong uVar2;
  
  uVar2 = this->total_value_count;
  if (((uVar2 & 0x3ff) == 0) && (uVar2 < this->count)) {
    if (vector_size == 0x400) {
      LoadVector<true>(this,values);
      iVar1 = this->total_value_count + 0x400;
      goto LAB_01736cb4;
    }
    LoadVector<false>(this,(this->vector_state).decoded_values);
    uVar2 = this->total_value_count;
  }
  (this->vector_state).index = (this->vector_state).index + vector_size;
  iVar1 = uVar2 + vector_size;
LAB_01736cb4:
  this->total_value_count = iVar1;
  return;
}

Assistant:

void ScanVector(EXACT_TYPE *values, idx_t vector_size) {
		D_ASSERT(vector_size <= AlpRDConstants::ALP_VECTOR_SIZE);
		D_ASSERT(vector_size <= LeftInVector());
		if (VectorFinished() && total_value_count < count) {
			if (vector_size == AlpRDConstants::ALP_VECTOR_SIZE) {
				LoadVector<SKIP>(values);
				total_value_count += vector_size;
				return;
			} else {
				// Even if SKIP is given, the vector size is not big enough to be able to fully skip the entire vector
				LoadVector<false>(vector_state.decoded_values);
			}
		}
		vector_state.template Scan<SKIP>((uint8_t *)values, vector_size);

		total_value_count += vector_size;
	}